

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fp-impl.inc.c
# Opt level: O2

void gen_compute_fprf_float64(TCGContext_conflict10 *tcg_ctx,TCGv_i64 arg)

{
  TCGTemp *local_18;
  TCGv_i64 local_10;
  
  local_18 = (TCGTemp *)(tcg_ctx->cpu_env + (long)tcg_ctx);
  local_10 = arg + (long)tcg_ctx;
  tcg_gen_callN_ppc64(tcg_ctx,helper_compute_fprf_float64,(TCGTemp *)0x0,2,&local_18);
  gen_helper_float_check_status(tcg_ctx,tcg_ctx->cpu_env);
  return;
}

Assistant:

static inline void gen_compute_fprf_float64(TCGContext *tcg_ctx, TCGv_i64 arg)
{
    gen_helper_compute_fprf_float64(tcg_ctx, tcg_ctx->cpu_env, arg);
    gen_helper_float_check_status(tcg_ctx, tcg_ctx->cpu_env);
}